

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O3

void __thiscall
QRasterPaintEngine::fillPath(QRasterPaintEngine *this,QPainterPath *path,QSpanData *fillData)

{
  QRasterPaintEnginePrivate *this_00;
  QPaintEngineState *pQVar1;
  ProcessSpans callback;
  QRasterizer *this_01;
  QPaintEnginePrivate *pQVar2;
  qreal qVar3;
  bool bVar4;
  Representation RVar5;
  FillRule fillRule;
  QT_FT_Outline *outline;
  Representation RVar6;
  long lVar7;
  QPaintEngineState *pQVar8;
  QTransform *pQVar9;
  qreal *pqVar10;
  QRasterBuffer *in_R8;
  long in_FS_OFFSET;
  byte bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  qreal scale;
  undefined1 local_88 [32];
  undefined8 local_68;
  undefined8 uStack_60;
  QRectF local_58;
  long local_38;
  
  bVar11 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (fillData->blend != (ProcessSpans)0x0) {
    this_00 = (QRasterPaintEnginePrivate *)(this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
    local_58.w._0_4_ = 0xffffffff;
    local_58.w._4_4_ = 0xffffffff;
    local_58.h._0_4_ = 0xffffffff;
    local_58.h._4_4_ = 0xffffffff;
    local_58.xp._0_4_ = 0xffffffff;
    local_58.xp._4_4_ = 0xffffffff;
    local_58.yp._0_4_ = 0xffffffff;
    local_58.yp._4_4_ = 0xffffffff;
    QPainterPath::controlPointRect(&local_58,path);
    pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
    pQVar8 = pQVar1 + -2;
    if (pQVar1 == (QPaintEngineState *)0x0) {
      pQVar8 = (QPaintEngineState *)0x0;
    }
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QTransform::mapRect((QRectF *)local_88,(QTransform *)(pQVar8 + 0x36),&local_58);
    dVar12 = (double)(local_88._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             (double)local_88._0_8_;
    dVar13 = dVar12;
    if (dVar12 <= -2147483648.0) {
      dVar13 = -2147483648.0;
    }
    dVar12 = (double)(-(ulong)(2147483647.0 < dVar12) & 0x41dfffffffc00000 |
                     ~-(ulong)(2147483647.0 < dVar12) & (ulong)dVar13);
    RVar5.m_i = (int)dVar12;
    dVar14 = (double)(local_88._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             (double)local_88._8_8_;
    dVar13 = dVar14;
    if (dVar14 <= -2147483648.0) {
      dVar13 = -2147483648.0;
    }
    dVar14 = (double)(-(ulong)(2147483647.0 < dVar14) & 0x41dfffffffc00000 |
                     ~-(ulong)(2147483647.0 < dVar14) & (ulong)dVar13);
    RVar6.m_i = (int)dVar14;
    dVar13 = ((double)local_88._0_8_ - (double)(int)dVar12) * 0.5 + (double)local_88._16_8_;
    dVar13 = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
    bVar4 = 2147483647.0 < dVar13;
    if (dVar13 <= -2147483648.0) {
      dVar13 = -2147483648.0;
    }
    dVar14 = ((double)local_88._8_8_ - (double)(int)dVar14) * 0.5 + (double)local_88._24_8_;
    dVar14 = (double)((ulong)dVar14 & 0x8000000000000000 | 0x3fe0000000000000) + dVar14;
    dVar12 = dVar14;
    if (dVar14 <= -2147483648.0) {
      dVar12 = -2147483648.0;
    }
    local_68 = (undefined1 *)CONCAT44(RVar6.m_i,RVar5.m_i);
    uStack_60 = (undefined1 *)
                CONCAT44((int)(double)(-(ulong)(2147483647.0 < dVar14) & 0x41dfffffffc00000 |
                                      ~-(ulong)(2147483647.0 < dVar14) & (ulong)dVar12) + RVar6.m_i
                         + -1,(int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 |
                                           ~-(ulong)bVar4 & (ulong)dVar13) + RVar5.m_i + -1);
    bVar4 = QRasterPaintEnginePrivate::isUnclipped(this_00,(QRect *)&local_68,0);
    callback = (&fillData->blend)[bVar4];
    if ((((local_68._0_4_ < -0x7fffff) || (0x7fffff < uStack_60._0_4_)) ||
        (local_68._4_4_ < -0x7fffff)) ||
       ((0x7fffff < uStack_60._4_4_ ||
        ((pQVar8[0x105].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
          super_QFlagsStorage<QPaintEngine::DirtyFlag>.i & 8) != 0)))) {
      pQVar2 = (this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
      if (((ulong)pQVar2[10].baseSystemClip.d & 0x200000000) != 0) {
        qVar3 = pQVar2[3].systemTransform.m_matrix[0][1];
        pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
        pQVar8 = pQVar1 + -2;
        if (pQVar1 == (QPaintEngineState *)0x0) {
          pQVar8 = (QPaintEngineState *)0x0;
        }
        pQVar9 = (QTransform *)(pQVar8 + 0x36);
        pqVar10 = (qreal *)((long)qVar3 + 0xf8);
        for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
          *pqVar10 = pQVar9->m_matrix[0][0];
          pQVar9 = (QTransform *)((long)pQVar9 + ((ulong)bVar11 * -2 + 1) * 8);
          pqVar10 = pqVar10 + (ulong)bVar11 * -2 + 1;
        }
        *(short *)((long)qVar3 + 0x140) =
             (short)pQVar8[0x48].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                    super_QFlagsStorage<QPaintEngine::DirtyFlag>.i;
        local_88._0_8_ = -NAN;
        qt_scaleForTransform((QTransform *)(pQVar8 + 0x36),(qreal *)local_88);
        *(ulong *)((long)qVar3 + 0x148) =
             -(ulong)((double)local_88._0_8_ == 0.0) & 0x3fd0000000000000 |
             ~-(ulong)((double)local_88._0_8_ == 0.0) & (ulong)(0.25 / (double)local_88._0_8_);
      }
      outline = QOutlineMapper::convertPath((this_00->outlineMapper).d,path);
      QRasterPaintEnginePrivate::rasterize(this_00,outline,callback,fillData,in_R8);
    }
    else {
      QRasterPaintEnginePrivate::initializeRasterizer(this_00,fillData);
      this_01 = (this_00->rasterizer).d;
      QTransform::map((QTransform *)local_88,(QPainterPath *)(pQVar8 + 0x36));
      fillRule = QPainterPath::fillRule(path);
      QRasterizer::rasterize(this_01,(QPainterPath *)local_88,fillRule);
      QPainterPath::~QPainterPath((QPainterPath *)local_88);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEngine::fillPath(const QPainterPath &path, QSpanData *fillData)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << " --- fillPath, bounds=" << path.boundingRect();
#endif

    if (!fillData->blend)
        return;

    Q_D(QRasterPaintEngine);

    const QRectF controlPointRect = path.controlPointRect();

    QRasterPaintEngineState *s = state();
    const QRect deviceRect = s->matrix.mapRect(controlPointRect).toRect();
    ProcessSpans blend = d->getBrushFunc(deviceRect, fillData);
    const bool do_clip = (deviceRect.left() < -QT_RASTER_COORD_LIMIT
                          || deviceRect.right() > QT_RASTER_COORD_LIMIT
                          || deviceRect.top() < -QT_RASTER_COORD_LIMIT
                          || deviceRect.bottom() > QT_RASTER_COORD_LIMIT);

    if (!s->flags.antialiased && !do_clip) {
        d->initializeRasterizer(fillData);
        d->rasterizer->rasterize(path * s->matrix, path.fillRule());
        return;
    }

    ensureOutlineMapper();
    d->rasterize(d->outlineMapper->convertPath(path), blend, fillData, d->rasterBuffer.data());
}